

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

void jit_trace_dump(Trace *trace)

{
  ulong uVar1;
  ulong uVar2;
  
  puts("---- Trace ----");
  if (1 < trace->ir_count) {
    uVar2 = 1;
    do {
      uVar1 = trace->ir[uVar2];
      printf("  %0.4d  %s  %d  %d\n",uVar2 & 0xffffffff,IROP_NAMES[(uint)uVar1 & 0xffff],
             uVar1 >> 0x10 & 0xffff,(ulong)((uint)(uVar1 >> 0x20) & 0xffff));
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)trace->ir_count);
  }
  return;
}

Assistant:

void jit_trace_dump(Trace *trace) {
	printf("---- Trace ----\n");
	for (int i = 1; i < trace->ir_count; i++) {
		IrIns *ins = &trace->ir[i];
		printf("  %0.4d  %s  %d  %d\n", i, IROP_NAMES[ir_op(*ins)], 
			ir_arg1(*ins), ir_arg2(*ins));
	}
}